

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

void __thiscall
SkylineBinPack::AddWasteMapArea
          (SkylineBinPack *this,int skylineNodeIndex,int width,int height,int y)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int a;
  uint uVar4;
  SkylineNode *pSVar5;
  TArray<Rect,_Rect> *this_00;
  undefined1 local_44 [8];
  Rect waste;
  int rightSide;
  int leftSide;
  int rectRight;
  int rectLeft;
  int wastedArea;
  int y_local;
  int height_local;
  int width_local;
  int skylineNodeIndex_local;
  SkylineBinPack *this_local;
  
  pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                     (&this->skyLine,(long)skylineNodeIndex);
  iVar1 = pSVar5->x;
  a = iVar1 + width;
  height_local = skylineNodeIndex;
  while( true ) {
    uVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Size(&this->skyLine);
    bVar3 = false;
    if (height_local < (int)uVar4) {
      pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(long)height_local);
      bVar3 = pSVar5->x < a;
    }
    if ((!bVar3) ||
       (pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                           (&this->skyLine,(long)height_local), a <= pSVar5->x)) {
      return;
    }
    pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    iVar2 = pSVar5->x;
    pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    if (iVar2 + pSVar5->width <= iVar1) {
      return;
    }
    pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    iVar2 = pSVar5->x;
    waste.height = iVar2;
    pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    waste.width = MIN<int>(a,iVar2 + pSVar5->width);
    pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    if (y < pSVar5->y) break;
    local_44._0_4_ = waste.height;
    pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    local_44._4_4_ = pSVar5->y;
    waste.x = waste.width - waste.height;
    pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    waste.y = y - pSVar5->y;
    bVar3 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)local_44);
    if (!bVar3) {
      __assert_fail("disjointRects.Disjoint(waste)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0xc6,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
    }
    this_00 = GuillotineBinPack::GetFreeRectangles(&this->wasteMap);
    TArray<Rect,_Rect>::Push(this_00,(Rect *)local_44);
    height_local = height_local + 1;
  }
  __assert_fail("y >= skyLine[skylineNodeIndex].y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                ,0xbd,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
}

Assistant:

void SkylineBinPack::AddWasteMapArea(int skylineNodeIndex, int width, int height, int y)
{
	int wastedArea = 0;
	const int rectLeft = skyLine[skylineNodeIndex].x;
	const int rectRight = rectLeft + width;
	for(; skylineNodeIndex < (int)skyLine.Size() && skyLine[skylineNodeIndex].x < rectRight; ++skylineNodeIndex)
	{
		if (skyLine[skylineNodeIndex].x >= rectRight || skyLine[skylineNodeIndex].x + skyLine[skylineNodeIndex].width <= rectLeft)
			break;

		int leftSide = skyLine[skylineNodeIndex].x;
		int rightSide = MIN(rectRight, leftSide + skyLine[skylineNodeIndex].width);
		assert(y >= skyLine[skylineNodeIndex].y);

		Rect waste;
		waste.x = leftSide;
		waste.y = skyLine[skylineNodeIndex].y;
		waste.width = rightSide - leftSide;
		waste.height = y - skyLine[skylineNodeIndex].y;

#ifdef _DEBUG
		assert(disjointRects.Disjoint(waste));
#endif
		wasteMap.GetFreeRectangles().Push(waste);
	}
}